

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.h
# Opt level: O1

void __thiscall
Liby::BinaryHeap<Liby::WeakTimerHolder>::insert
          (BinaryHeap<Liby::WeakTimerHolder> *this,const_reference_type x)

{
  vector<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_> *this_00;
  BasicHandler *pBVar1;
  pointer pWVar2;
  long lVar3;
  pointer pWVar4;
  bool bVar5;
  __suseconds_t _Var6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  
  this_00 = &this->heap;
  lVar7 = (long)(this->heap).
                super__Vector_base<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->heap).
                super__Vector_base<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  if (lVar7 * -0x71c71c71c71c71c7 - 1U == (ulong)this->size_) {
    std::vector<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>::resize
              (this_00,lVar7 * 0x1c71c71c71c71c72);
  }
  uVar8 = this->size_ + 1;
  this->size_ = uVar8;
  if (uVar8 < 2) {
LAB_0010de3f:
    uVar9 = (ulong)uVar8;
  }
  else {
    uVar9 = (ulong)uVar8;
    do {
      uVar9 = uVar9 >> 1;
      pWVar2 = (this_00->
               super__Vector_base<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pWVar4 = pWVar2 + uVar9;
      lVar7 = (x->timer_).timeout_.tv_.tv_sec;
      lVar3 = (pWVar4->timer_).timeout_.tv_.tv_sec;
      if (((lVar3 <= lVar7) &&
          ((lVar3 < lVar7 ||
           (*(__suseconds_t *)((long)&(pWVar4->timer_).timeout_.tv_ + 8) <=
            (x->timer_).timeout_.tv_.tv_usec)))) || ((pWVar4->timer_).id_ <= (x->timer_).id_))
      goto LAB_0010de3f;
      pBVar1 = &pWVar2[uVar8].timer_.handler_;
      *(uint64_t *)((long)(pBVar1 + -1) + 8) = (pWVar4->timer_).id_;
      _Var6 = *(__suseconds_t *)((long)&pWVar2[uVar9].timer_.timeout_.tv_ + 8);
      *(__time_t *)((long)(pBVar1 + -1) + 0x10) = pWVar2[uVar9].timer_.timeout_.tv_.tv_sec;
      *(__suseconds_t *)((long)(pBVar1 + -1) + 0x18) = _Var6;
      std::function<void_()>::operator=(pBVar1,&(pWVar4->timer_).handler_);
      *(element_type **)(pBVar1 + 1) =
           (pWVar4->weakTimerPtr_).super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&pWVar2[uVar8].weakTimerPtr_.
                  super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 &(pWVar4->weakTimerPtr_).super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      bVar5 = 3 < uVar8;
      uVar8 = (uint)uVar9;
    } while (bVar5);
  }
  pWVar4 = (this_00->
           super__Vector_base<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pBVar1 = &pWVar4[uVar9].timer_.handler_;
  *(uint64_t *)((long)(pBVar1 + -1) + 8) = (x->timer_).id_;
  _Var6 = (x->timer_).timeout_.tv_.tv_usec;
  *(__time_t *)((long)(pBVar1 + -1) + 0x10) = (x->timer_).timeout_.tv_.tv_sec;
  *(__suseconds_t *)((long)(pBVar1 + -1) + 0x18) = _Var6;
  std::function<void_()>::operator=(pBVar1,&(x->timer_).handler_);
  *(element_type **)(pBVar1 + 1) =
       (x->weakTimerPtr_).super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&pWVar4[uVar9].weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(x->weakTimerPtr_).super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void insert(const_reference_type x) {
        if (size_ == heap.size() - 1)
            heap.resize(heap.size() * 2);

        size_type hole = ++size_;
        for (; hole > 1 && x < heap[hole / 2]; hole /= 2)
            heap[hole] = heap[hole / 2];
        heap[hole] = x;
    }